

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogManager.cpp
# Opt level: O0

void __thiscall gnilk::LogManager::IterateLogs(LogManager *this,LogDelegate *cbInstance)

{
  lock_guard<std::mutex> this_00;
  bool bVar1;
  reference ppVar2;
  undefined1 local_98 [24];
  type *inst;
  type *name;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gnilk::LogInstance>_>
  local_68;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gnilk::LogInstance>_>,_true>
  local_38;
  iterator __end1;
  iterator __begin1;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gnilk::LogInstance>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gnilk::LogInstance>_>_>_>
  *__range1;
  lock_guard<std::mutex> lock;
  LogDelegate *cbInstance_local;
  LogManager *this_local;
  
  lock._M_device = (mutex_type *)cbInstance;
  std::lock_guard<std::mutex>::lock_guard((lock_guard<std::mutex> *)&__range1,&this->instLock);
  __end1 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gnilk::LogInstance>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gnilk::LogInstance>_>_>_>
           ::begin(&this->logInstances);
  local_38._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gnilk::LogInstance>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gnilk::LogInstance>_>_>_>
       ::end(&this->logInstances);
  while( true ) {
    bVar1 = std::__detail::operator==
                      (&__end1.
                        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gnilk::LogInstance>_>,_true>
                       ,&local_38);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    ppVar2 = std::__detail::
             _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gnilk::LogInstance>_>,_false,_true>
             ::operator*(&__end1);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gnilk::LogInstance>_>
    ::pair(&local_68,ppVar2);
    inst = (type *)std::get<0ul,std::__cxx11::string_const,std::shared_ptr<gnilk::LogInstance>>
                             (&local_68);
    local_98._16_8_ =
         std::get<1ul,std::__cxx11::string_const,std::shared_ptr<gnilk::LogInstance>>(&local_68);
    this_00 = lock;
    std::__shared_ptr_access<gnilk::LogInstance,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<gnilk::LogInstance,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               local_98._16_8_);
    LogInstance::GetLog((LogInstance *)local_98);
    std::function<bool_(const_std::shared_ptr<gnilk::Log>_&)>::operator()
              ((function<bool_(const_std::shared_ptr<gnilk::Log>_&)> *)this_00._M_device,
               (shared_ptr<gnilk::Log> *)local_98);
    std::shared_ptr<gnilk::Log>::~shared_ptr((shared_ptr<gnilk::Log> *)local_98);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gnilk::LogInstance>_>
    ::~pair(&local_68);
    std::__detail::
    _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gnilk::LogInstance>_>,_false,_true>
    ::operator++(&__end1);
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&__range1);
  return;
}

Assistant:

void LogManager::IterateLogs(const LogDelegate &cbInstance) {
    std::lock_guard<std::mutex> lock(instLock);
    for(auto [name, inst] : logInstances) {
        cbInstance(inst->GetLog());
    }
}